

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap10_validate(FT_Byte *table,FT_Validator valid)

{
  ulong uVar1;
  ulong uStack_30;
  FT_UInt gindex;
  FT_ULong count;
  FT_ULong length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  if (valid->limit < table + 0x14) {
    ft_validator_error(valid,8);
  }
  uVar1 = (ulong)((uint)table[4] << 0x18 | (uint)table[5] << 0x10 | (uint)table[6] << 8 |
                 (uint)table[7]);
  length = (FT_ULong)(table + 0x14);
  uStack_30 = (ulong)((uint)table[0x10] << 0x18 | (uint)table[0x11] << 0x10 | (uint)table[0x12] << 8
                     | (uint)table[0x13]);
  if ((((ulong)((long)valid->limit - (long)table) < uVar1) || (uVar1 < 0x14)) ||
     (uVar1 - 0x14 >> 1 < uStack_30)) {
    ft_validator_error(valid,8);
  }
  if (valid->level != FT_VALIDATE_DEFAULT) {
    for (; uStack_30 != 0; uStack_30 = uStack_30 - 1) {
      if ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
          (uint)CONCAT11(*(undefined1 *)length,*(undefined1 *)(length + 1))) {
        ft_validator_error(valid,0x10);
      }
      length = length + 2;
    }
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap10_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p = table + 4;
    FT_ULong  length, count;


    if ( table + 20 > valid->limit )
      FT_INVALID_TOO_SHORT;

    length = TT_NEXT_ULONG( p );
    p      = table + 16;
    count  = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 20 + count * 2 ? */
         length < 20                                 ||
         ( length - 20 ) / 2 < count                 )
      FT_INVALID_TOO_SHORT;

    /* check glyph indices */
    if ( valid->level >= FT_VALIDATE_TIGHT )
    {
      FT_UInt  gindex;


      for ( ; count > 0; count-- )
      {
        gindex = TT_NEXT_USHORT( p );
        if ( gindex >= TT_VALID_GLYPH_COUNT( valid ) )
          FT_INVALID_GLYPH_ID;
      }
    }

    return FT_Err_Ok;
  }